

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::Textures::BufferTest::CleanProgram(BufferTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_po != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1680))(0);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))(this->m_po);
    this->m_po = 0;
  }
  return;
}

Assistant:

void BufferTest::CleanProgram()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Program. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}
}